

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O2

void __thiscall MCTS::Node<ConnectFourState>::~Node(Node<ConnectFourState> *this)

{
  pointer ppNVar1;
  Node<ConnectFourState> *this_00;
  pointer ppNVar2;
  
  ppNVar1 = (this->children).
            super__Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppNVar2 = (this->children).
                 super__Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppNVar2 != ppNVar1;
      ppNVar2 = ppNVar2 + 1) {
    this_00 = *ppNVar2;
    if (this_00 != (Node<ConnectFourState> *)0x0) {
      ~Node(this_00);
    }
    operator_delete(this_00);
  }
  std::_Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
  ::~_Vector_base(&(this->children).
                   super__Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
                 );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->moves).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

Node<State>::~Node()
{
	for (auto child: children) {
		delete child;
	}
}